

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O0

char16_t * __thiscall icu_63::number::impl::DecimalQuantity::checkHealth(DecimalQuantity *this)

{
  int iVar1;
  int8_t iVar2;
  int local_2c;
  int local_28;
  int i_3;
  int i_2;
  int i_1;
  int i;
  int32_t capacity;
  DecimalQuantity *this_local;
  
  if ((this->usingBytes & 1U) == 0) {
    if ((this->precision == 0) && ((this->fBCD).bcdBytes.ptr != (int8_t *)0x0)) {
      this_local = (DecimalQuantity *)anon_var_dwarf_7d59b;
      return (char16_t *)this_local;
    }
    if (0x10 < this->precision) {
      this_local = (DecimalQuantity *)anon_var_dwarf_7d5b2;
      return (char16_t *)this_local;
    }
    if ((this->precision != 0) && (iVar2 = getDigitPos(this,this->precision + -1), iVar2 == '\0')) {
      this_local = (DecimalQuantity *)anon_var_dwarf_7d5bd;
      return (char16_t *)this_local;
    }
    if ((this->precision != 0) && (iVar2 = getDigitPos(this,0), iVar2 == '\0')) {
      this_local = (DecimalQuantity *)anon_var_dwarf_7d53f;
      return (char16_t *)this_local;
    }
    for (local_28 = 0; local_28 < this->precision; local_28 = local_28 + 1) {
      iVar2 = getDigitPos(this,local_28);
      if ('\t' < iVar2) {
        this_local = (DecimalQuantity *)anon_var_dwarf_7d5c8;
        return (char16_t *)this_local;
      }
      iVar2 = getDigitPos(this,local_28);
      if (iVar2 < '\0') {
        this_local = (DecimalQuantity *)anon_var_dwarf_7d5df;
        return (char16_t *)this_local;
      }
    }
    for (local_2c = this->precision; local_2c < 0x10; local_2c = local_2c + 1) {
      iVar2 = getDigitPos(this,local_2c);
      if (iVar2 != '\0') {
        this_local = (DecimalQuantity *)anon_var_dwarf_7d5ea;
        return (char16_t *)this_local;
      }
    }
  }
  else {
    if (this->precision == 0) {
      this_local = (DecimalQuantity *)anon_var_dwarf_7d506;
      return (char16_t *)this_local;
    }
    iVar1 = (this->fBCD).bcdBytes.len;
    if (iVar1 < this->precision) {
      this_local = (DecimalQuantity *)anon_var_dwarf_7d51d;
      return (char16_t *)this_local;
    }
    iVar2 = getDigitPos(this,this->precision + -1);
    if (iVar2 == '\0') {
      this_local = (DecimalQuantity *)anon_var_dwarf_7d528;
      return (char16_t *)this_local;
    }
    iVar2 = getDigitPos(this,0);
    if (iVar2 == '\0') {
      this_local = (DecimalQuantity *)anon_var_dwarf_7d53f;
      return (char16_t *)this_local;
    }
    for (i_2 = 0; i_2 < this->precision; i_2 = i_2 + 1) {
      iVar2 = getDigitPos(this,i_2);
      if ('\t' < iVar2) {
        this_local = (DecimalQuantity *)anon_var_dwarf_7d556;
        return (char16_t *)this_local;
      }
      iVar2 = getDigitPos(this,i_2);
      if (iVar2 < '\0') {
        this_local = (DecimalQuantity *)anon_var_dwarf_7d56d;
        return (char16_t *)this_local;
      }
    }
    for (i_3 = this->precision; i_3 < iVar1; i_3 = i_3 + 1) {
      iVar2 = getDigitPos(this,i_3);
      if (iVar2 != '\0') {
        this_local = (DecimalQuantity *)anon_var_dwarf_7d584;
        return (char16_t *)this_local;
      }
    }
  }
  return (char16_t *)0x0;
}

Assistant:

const char16_t* DecimalQuantity::checkHealth() const {
    if (usingBytes) {
        if (precision == 0) { return u"Zero precision but we are in byte mode"; }
        int32_t capacity = fBCD.bcdBytes.len;
        if (precision > capacity) { return u"Precision exceeds length of byte array"; }
        if (getDigitPos(precision - 1) == 0) { return u"Most significant digit is zero in byte mode"; }
        if (getDigitPos(0) == 0) { return u"Least significant digit is zero in long mode"; }
        for (int i = 0; i < precision; i++) {
            if (getDigitPos(i) >= 10) { return u"Digit exceeding 10 in byte array"; }
            if (getDigitPos(i) < 0) { return u"Digit below 0 in byte array"; }
        }
        for (int i = precision; i < capacity; i++) {
            if (getDigitPos(i) != 0) { return u"Nonzero digits outside of range in byte array"; }
        }
    } else {
        if (precision == 0 && fBCD.bcdLong != 0) {
            return u"Value in bcdLong even though precision is zero";
        }
        if (precision > 16) { return u"Precision exceeds length of long"; }
        if (precision != 0 && getDigitPos(precision - 1) == 0) {
            return u"Most significant digit is zero in long mode";
        }
        if (precision != 0 && getDigitPos(0) == 0) {
            return u"Least significant digit is zero in long mode";
        }
        for (int i = 0; i < precision; i++) {
            if (getDigitPos(i) >= 10) { return u"Digit exceeding 10 in long"; }
            if (getDigitPos(i) < 0) { return u"Digit below 0 in long (?!)"; }
        }
        for (int i = precision; i < 16; i++) {
            if (getDigitPos(i) != 0) { return u"Nonzero digits outside of range in long"; }
        }
    }

    // No error
    return nullptr;
}